

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_ConstPointerReturnValue_Test::
~TEST_MockReturnValueTest_ConstPointerReturnValue_Test
          (TEST_MockReturnValueTest_ConstPointerReturnValue_Test *this)

{
  TEST_MockReturnValueTest_ConstPointerReturnValue_Test *this_local;
  
  ~TEST_MockReturnValueTest_ConstPointerReturnValue_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockReturnValueTest, ConstPointerReturnValue)
{
    const void* ptr = (const void*) 0x001074;
    mock().expectOneCall("foo").andReturnValue(ptr);
    MockActualCall& actual_call = mock().actualCall("foo");
    POINTERS_EQUAL(ptr, actual_call.returnValue().getConstPointerValue());
    POINTERS_EQUAL(ptr, actual_call.returnConstPointerValue());
    POINTERS_EQUAL(ptr, mock().constPointerReturnValue());
}